

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawBar::Parse(CommandDrawBar *this,FScanner *sc,bool fullScreenOffsets)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  SBarInfo *pSVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  PClassActor *pPVar9;
  ClassReg *pCVar10;
  
  FScanner::MustGetToken(sc,0x102);
  iVar7 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->foreground = iVar7;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar7 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->background = iVar7;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar5 = FScanner::Compare(sc,"health");
  if (bVar5) {
    this->type = HEALTH;
  }
  else {
    bVar5 = FScanner::Compare(sc,"armor");
    if (!bVar5) {
      bVar5 = FScanner::Compare(sc,"ammo1");
      if (bVar5) {
        this->type = AMMO1;
        goto LAB_005754a2;
      }
      bVar5 = FScanner::Compare(sc,"ammo2");
      if (bVar5) {
        this->type = AMMO2;
        goto LAB_005754a2;
      }
      bVar5 = FScanner::Compare(sc,"ammo");
      if (bVar5) {
        bVar5 = FScanner::CheckToken(sc,0x28);
        if ((!bVar5) || (bVar6 = FScanner::CheckToken(sc,0x102), !bVar6)) {
          FScanner::MustGetToken(sc,0x101);
        }
        this->type = AMMO;
        pPVar9 = PClass::FindActor(sc->String);
        (this->data).field_1.inventoryItem = pPVar9;
        if ((pPVar9 == (PClassActor *)0x0) ||
           (bVar6 = PClass::IsAncestorOf(AAmmo::RegistrationInfo.MyClass,&pPVar9->super_PClass),
           !bVar6)) {
          FScanner::ScriptMessage(sc,"\'%s\' is not a type of ammo.",sc->String);
          pCVar10 = &AAmmo::RegistrationInfo;
LAB_0057573a:
          (this->data).field_1 = *(anon_union_8_2_d4833da3_for_AdditionalData_1 *)pCVar10;
        }
      }
      else {
        bVar5 = FScanner::Compare(sc,"frags");
        if (bVar5) {
          this->type = FRAGS;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"kills");
        if (bVar5) {
          this->type = KILLS;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"items");
        if (bVar5) {
          this->type = ITEMS;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"secrets");
        if (bVar5) {
          this->type = SECRETS;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"airtime");
        if (bVar5) {
          this->type = AIRTIME;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"savepercent");
        if (bVar5) {
          this->type = SAVEPERCENT;
          goto LAB_005754a2;
        }
        bVar5 = FScanner::Compare(sc,"poweruptime");
        if (!bVar5) {
          this->type = INVENTORY;
          pPVar9 = PClass::FindActor(sc->String);
          (this->data).field_1.inventoryItem = pPVar9;
          if ((pPVar9 == (PClassActor *)0x0) ||
             (bVar5 = PClass::IsAncestorOf
                                (AInventory::RegistrationInfo.MyClass,&pPVar9->super_PClass), !bVar5
             )) {
            FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
            (this->data).field_1.inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass
            ;
          }
          goto LAB_005754a2;
        }
        bVar5 = FScanner::CheckToken(sc,0x28);
        this->type = POWERUPTIME;
        if ((!bVar5) || (bVar6 = FScanner::CheckToken(sc,0x102), !bVar6)) {
          FScanner::MustGetToken(sc,0x101);
        }
        pPVar9 = PClass::FindActor(sc->String);
        (this->data).field_1.inventoryItem = pPVar9;
        if ((pPVar9 == (PClassActor *)0x0) ||
           (bVar6 = PClass::IsAncestorOf
                              (APowerupGiver::RegistrationInfo.MyClass,&pPVar9->super_PClass),
           !bVar6)) {
          FScanner::ScriptMessage(sc,"\'%s\' is not a type of PowerupGiver.",sc->String);
          pCVar10 = &APowerupGiver::RegistrationInfo;
          goto LAB_0057573a;
        }
      }
      if (bVar5 != false) {
        FScanner::MustGetToken(sc,0x29);
      }
      goto LAB_005754a2;
    }
    this->type = ARMOR;
  }
  ParseComparator(this,sc);
LAB_005754a2:
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar5 = FScanner::Compare(sc,"horizontal");
  if (bVar5) {
    this->horizontal = true;
  }
  else {
    bVar5 = FScanner::Compare(sc,"vertical");
    if (!bVar5) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  piVar1 = &this->interpolationSpeed;
  while (bVar5 = FScanner::CheckToken(sc,0x101), bVar5) {
    bVar5 = FScanner::Compare(sc,"reverse");
    if (bVar5) {
      this->reverse = true;
    }
    else {
      bVar5 = FScanner::Compare(sc,"interpolate");
      if (bVar5) {
        FScanner::MustGetToken(sc,0x28);
        FScanner::MustGetToken(sc,0x104);
        *piVar1 = sc->Number;
        FScanner::MustGetToken(sc,0x29);
      }
      else {
        FScanner::ScriptError(sc,"Unkown flag \'%s\'.",sc->String);
      }
    }
    bVar5 = FScanner::CheckToken(sc,0x7c);
    if (!bVar5) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  bVar5 = FScanner::CheckToken(sc,0x2c);
  if (bVar5) {
    FScanner::MustGetToken(sc,0x104);
    uVar3 = sc->Number;
    this->border = uVar3;
    if (uVar3 != 0) {
      this->reverse = (bool)(this->reverse ^ 1);
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  if (this->type == ARMOR) {
    pSVar4 = (this->super_SBarInfoCommand).script;
    piVar8 = &pSVar4->armorInterpolationSpeed;
    cVar2 = pSVar4->interpolateArmor;
  }
  else {
    if (this->type != HEALTH) {
      return;
    }
    pSVar4 = (this->super_SBarInfoCommand).script;
    piVar8 = &pSVar4->interpolationSpeed;
    cVar2 = pSVar4->interpolateHealth;
  }
  if (cVar2 == '\0') {
    piVar8 = piVar1;
  }
  *piVar1 = *piVar8;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_StringConst);
			foreground = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst);
			background = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("health"))
			{
				type = HEALTH;
				ParseComparator(sc);
			}
			else if(sc.Compare("armor"))
			{
				type = ARMOR;
				ParseComparator(sc);
			}
			else if(sc.Compare("ammo1"))
				type = AMMO1;
			else if(sc.Compare("ammo2"))
				type = AMMO2;
			else if(sc.Compare("ammo")) //request the next string to be an ammo type
			{
				bool parenthesized = sc.CheckToken('(');

				if(!parenthesized || !sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				type = AMMO;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(data.inventoryItem)) //must be a kind of ammo
				{
					sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AAmmo);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else if(sc.Compare("frags"))
				type = FRAGS;
			else if(sc.Compare("kills"))
				type = KILLS;
			else if(sc.Compare("items"))
				type = ITEMS;
			else if(sc.Compare("secrets"))
				type = SECRETS;
			else if(sc.Compare("airtime"))
				type = AIRTIME;
			else if(sc.Compare("savepercent"))
				type = SAVEPERCENT;
			else if(sc.Compare("poweruptime"))
			{
				bool parenthesized = sc.CheckToken('(');

				type = POWERUPTIME;
				if(!parenthesized || !sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(APowerupGiver);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else
			{
				type = INVENTORY;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("horizontal"))
				horizontal = true;
			else if(!sc.Compare("vertical"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("reverse"))
					reverse = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unkown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, x, y);
			if(sc.CheckToken(',')) //border
			{
				sc.MustGetToken(TK_IntConst);
				border = sc.Number;

				// Flip the direction since it represents the area to clip
				if(border != 0)
					reverse = !reverse;
			}
			sc.MustGetToken(';');
		
			if(type == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(type == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}